

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::_InternalSerialize
          (CodeGeneratorResponse_File *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint32_t *puVar4;
  char *pcVar5;
  string *psVar6;
  uint8_t *target_00;
  GeneratedCodeInfo *value;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  CodeGeneratorResponse_File *this_local;
  
  puVar4 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  uVar1 = *puVar4;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    _internal_name_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    _internal_name_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"google.protobuf.compiler.CodeGeneratorResponse.File.name");
    psVar6 = _internal_name_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,psVar6,target);
  }
  if ((uVar1 & 2) != 0) {
    _internal_insertion_point_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    _internal_insertion_point_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point");
    psVar6 = _internal_insertion_point_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,2,psVar6,(uint8_t *)stream_local);
  }
  if ((uVar1 & 4) != 0) {
    _internal_content_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    _internal_content_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"google.protobuf.compiler.CodeGeneratorResponse.File.content")
    ;
    psVar6 = _internal_content_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0xf,psVar6,(uint8_t *)stream_local);
  }
  if ((uVar1 & 8) != 0) {
    target_00 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value = _Internal::generated_code_info(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::
                   InternalWriteMessage<google::protobuf::GeneratedCodeInfo>
                             (0x10,value,target_00,stream);
  }
  bVar2 = internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* CodeGeneratorResponse_File::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorResponse.File.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string insertion_point = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_insertion_point().data(), static_cast<int>(this->_internal_insertion_point().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_insertion_point(), target);
  }

  // optional string content = 15;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_content().data(), static_cast<int>(this->_internal_content().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorResponse.File.content");
    target = stream->WriteStringMaybeAliased(
        15, this->_internal_content(), target);
  }

  // optional .google.protobuf.GeneratedCodeInfo generated_code_info = 16;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        16, _Internal::generated_code_info(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorResponse.File)
  return target;
}